

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O0

void duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_class_24_3_3d016869 fun;
  bool bVar1;
  undefined8 uVar2;
  double *pdVar3;
  ulong uVar4;
  VectorType in_DL;
  DataChunk *in_RDI;
  double *rhs_data;
  double *lhs_data;
  Vector *rhs_child;
  Vector *lhs_child;
  idx_t rhs_count;
  idx_t lhs_count;
  value_type *rhs_vec;
  value_type *lhs_vec;
  idx_t count;
  string *func_name;
  BoundFunctionExpression *expr;
  ExecuteFunctionState *lstate;
  idx_t in_stack_fffffffffffffe88;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe90;
  idx_t in_stack_fffffffffffffeb8;
  allocator *paVar5;
  BaseExpression *in_stack_fffffffffffffed0;
  double *local_128;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  InvalidInputException *in_stack_ffffffffffffff00;
  allocator local_e9;
  string local_e8 [39];
  undefined1 local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  undefined8 local_50;
  Vector *local_48;
  Vector *local_40;
  idx_t local_38;
  BoundFunctionExpression *local_30;
  BoundFunctionExpression *local_28;
  ExecuteFunctionState *local_20;
  VectorType local_18;
  DataChunk *local_8;
  
  local_8 = in_RDI;
  local_18 = in_DL;
  local_20 = ExpressionState::Cast<duckdb::ExecuteFunctionState>
                       ((ExpressionState *)in_stack_fffffffffffffe90);
  local_28 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_stack_fffffffffffffed0);
  local_30 = local_28 + 0x60;
  local_38 = DataChunk::size(local_8);
  local_40 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe90,
                        in_stack_fffffffffffffe88);
  local_48 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe90,
                        in_stack_fffffffffffffe88);
  local_50 = duckdb::ListVector::GetListSize(local_40);
  local_58 = duckdb::ListVector::GetListSize(local_48);
  local_60 = duckdb::ListVector::GetEntry(local_40);
  local_68 = duckdb::ListVector::GetEntry(local_48);
  duckdb::Vector::Flatten(local_60);
  duckdb::Vector::Flatten(local_68);
  FlatVector::Validity((Vector *)0xd80d58);
  bVar1 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (!bVar1) {
    local_c1 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    paVar5 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"%s: left argument can not contain NULL values",paVar5);
    std::__cxx11::string::string(local_c0,(string *)local_30);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    local_c1 = 0;
    __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  FlatVector::Validity((Vector *)0xd80e9b);
  bVar1 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (bVar1) {
    pdVar3 = FlatVector::GetData<double>((Vector *)0xd80fcc);
    local_128 = FlatVector::GetData<double>((Vector *)0xd80fde);
    fun.lhs_data._0_7_ = in_stack_fffffffffffffee8;
    fun.func_name = (string *)pdVar3;
    fun.lhs_data._7_1_ = in_stack_fffffffffffffeef;
    fun.rhs_data = (double **)in_stack_fffffffffffffef0;
    BinaryExecutor::
    ExecuteWithNulls<duckdb::list_entry_t,duckdb::list_entry_t,double,duckdb::ListGenericFold<double,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_>
              ((Vector *)&local_128,(Vector *)&stack0xfffffffffffffee0,(Vector *)local_30,
               in_stack_fffffffffffffeb8,fun);
    uVar4 = duckdb::DataChunk::AllConstant();
    if ((uVar4 & 1) != 0) {
      duckdb::Vector::SetVectorType(local_18);
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"%s: right argument can not contain NULL values",&local_e9);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffef0,(string *)local_30);
  InvalidInputException::InvalidInputException<std::__cxx11::string>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}